

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  int local_c;
  
  std::istream::operator>>((istream *)&std::cin,&local_c);
  switch(local_c) {
  case 1:
    bVar1 = test1();
    break;
  case 2:
    bVar1 = test2();
    break;
  case 3:
    bVar1 = test3();
    break;
  case 4:
    bVar1 = test4();
    break;
  case 5:
    bVar1 = test5();
    break;
  case 6:
    bVar1 = test6();
    break;
  case 7:
    bVar1 = test7();
    break;
  case 8:
    bVar1 = test8();
    break;
  case 9:
    bVar1 = test9();
    pcVar3 = "OK ";
    goto LAB_00103530;
  case 10:
    bVar1 = test10();
    break;
  default:
    goto switchD_001034ea_default;
  }
  pcVar3 = "OK";
LAB_00103530:
  pcVar4 = "WRONG";
  if (bVar1 != false) {
    pcVar4 = pcVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
switchD_001034ea_default:
  return 0;
}

Assistant:

int main() {
  int i;
  std::cin >> i;
  switch(i) {
    case 1: std::cout << (test1() ? "OK" : "WRONG" ) << std::endl; break;
    case 2: std::cout << (test2() ? "OK" : "WRONG" ) << std::endl; break;
    case 3: std::cout << (test3() ? "OK" : "WRONG" ) << std::endl; break;
    case 4: std::cout << (test4() ? "OK" : "WRONG" ) << std::endl; break;
    case 5: std::cout << (test5() ? "OK" : "WRONG" ) << std::endl; break;
    case 6: std::cout << (test6() ? "OK" : "WRONG" ) << std::endl; break;
    case 7: std::cout << (test7() ? "OK" : "WRONG" ) << std::endl; break;
    case 8: std::cout << (test8() ? "OK" : "WRONG" ) << std::endl; break;
    case 9: std::cout << (test9() ? "OK " : "WRONG" ) << std::endl; break;
    case 10: std::cout << (test10() ? "OK" : "WRONG" ) << std::endl; break;
  }
}